

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_6379f8::Helper::GetDestinationForType
          (string *__return_storage_ptr__,Helper *this,cmInstallCommandArguments *args,string *type)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  cmInstallCommandArguments *args_00;
  cmInstallCommandArguments *args_01;
  cmInstallCommandArguments *args_02;
  cmInstallCommandArguments *args_03;
  cmInstallCommandArguments *args_04;
  cmInstallCommandArguments *args_05;
  cmInstallCommandArguments *args_06;
  size_type __dnew;
  string local_70;
  string local_50;
  
  if (args != (cmInstallCommandArguments *)0x0) {
    psVar3 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    if (psVar3->_M_string_length != 0) {
      psVar3 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (psVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
      return extraout_RAX;
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    psVar3 = (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
                       (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
    return psVar3;
  }
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_70._M_dataplus._M_p = (pointer)0x15;
    local_50._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_70);
    local_50.field_2._M_allocated_capacity = (size_type)local_70._M_dataplus._M_p;
    builtin_strncpy(local_50._M_dataplus._M_p,"CMAKE_INSTALL_SBINDIR",0x15);
    local_50._M_string_length = (size_type)local_70._M_dataplus._M_p;
    local_50._M_dataplus._M_p[(long)local_70._M_dataplus._M_p] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70.field_2._M_allocated_capacity._0_4_ = 0x6e696273;
    local_70._M_string_length = 4;
    local_70.field_2._M_allocated_capacity._4_4_ =
         local_70.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    psVar3 = GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_50,
                            &local_70);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 == 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_70._M_dataplus._M_p = (pointer)0x18;
      local_50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_70);
      local_50.field_2._M_allocated_capacity = (size_type)local_70._M_dataplus._M_p;
      builtin_strncpy(local_50._M_dataplus._M_p,"CMAKE_INSTALL_SYSCONFDIR",0x18);
      local_50._M_string_length = (size_type)local_70._M_dataplus._M_p;
      local_50._M_dataplus._M_p[(long)local_70._M_dataplus._M_p] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70.field_2._M_allocated_capacity._0_4_ = 0x637465;
      local_70._M_string_length = 3;
      psVar3 = GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_50
                              ,&local_70);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)type);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          psVar3 = (anonymous_namespace)::Helper::GetLocalStateDestination_abi_cxx11_
                             (__return_storage_ptr__,this,args_00);
          return psVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          psVar3 = (anonymous_namespace)::Helper::GetRunStateDestination_abi_cxx11_
                             (__return_storage_ptr__,this,args_01);
          return psVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          psVar3 = (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                             (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
          return psVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          psVar3 = (anonymous_namespace)::Helper::GetIncludeDestination_abi_cxx11_
                             (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
          return psVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          psVar3 = (anonymous_namespace)::Helper::GetDataDestination_abi_cxx11_
                             (__return_storage_ptr__,this,args_02);
          return psVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          psVar3 = (anonymous_namespace)::Helper::GetInfoDestination_abi_cxx11_
                             (__return_storage_ptr__,this,args_03);
          return psVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          psVar3 = (anonymous_namespace)::Helper::GetLocaleDestination_abi_cxx11_
                             (__return_storage_ptr__,this,args_04);
          return psVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)type);
          if (iVar2 != 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
            return extraout_RAX_00;
          }
          psVar3 = (anonymous_namespace)::Helper::GetDocDestination_abi_cxx11_
                             (__return_storage_ptr__,this,args_06);
          return psVar3;
        }
        psVar3 = (anonymous_namespace)::Helper::GetManDestination_abi_cxx11_
                           (__return_storage_ptr__,this,args_05);
        return psVar3;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_70._M_dataplus._M_p = (pointer)0x1c;
      local_50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_70);
      local_50.field_2._M_allocated_capacity = (size_type)local_70._M_dataplus._M_p;
      builtin_strncpy(local_50._M_dataplus._M_p,"CMAKE_INSTALL_SHAREDSTATEDIR",0x1c);
      local_50._M_string_length = (size_type)local_70._M_dataplus._M_p;
      local_50._M_dataplus._M_p[(long)local_70._M_dataplus._M_p] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70.field_2._M_allocated_capacity._0_4_ = 0x6d6f63;
      local_70._M_string_length = 3;
      psVar3 = GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_50
                              ,&local_70);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                             local_70.field_2._M_allocated_capacity._0_4_) + 1);
    psVar3 = extraout_RAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,(ulong)(local_50.field_2._M_allocated_capacity + 1));
    psVar3 = extraout_RAX_02;
  }
  return psVar3;
}

Assistant:

std::string Helper::GetDestinationForType(
  const cmInstallCommandArguments* args, const std::string& type) const
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  if (type == "BIN") {
    return this->GetRuntimeDestination(nullptr);
  }
  if (type == "SBIN") {
    return this->GetSbinDestination(nullptr);
  }
  if (type == "SYSCONF") {
    return this->GetSysconfDestination(nullptr);
  }
  if (type == "SHAREDSTATE") {
    return this->GetSharedStateDestination(nullptr);
  }
  if (type == "LOCALSTATE") {
    return this->GetLocalStateDestination(nullptr);
  }
  if (type == "RUNSTATE") {
    return this->GetRunStateDestination(nullptr);
  }
  if (type == "LIB") {
    return this->GetLibraryDestination(nullptr);
  }
  if (type == "INCLUDE") {
    return this->GetIncludeDestination(nullptr);
  }
  if (type == "DATA") {
    return this->GetDataDestination(nullptr);
  }
  if (type == "INFO") {
    return this->GetInfoDestination(nullptr);
  }
  if (type == "LOCALE") {
    return this->GetLocaleDestination(nullptr);
  }
  if (type == "MAN") {
    return this->GetManDestination(nullptr);
  }
  if (type == "DOC") {
    return this->GetDocDestination(nullptr);
  }
  return "";
}